

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall olc::Sprite::LoadFromPGESprFile(Sprite *this,string *sImageFile,ResourcePack *pack)

{
  byte bVar1;
  bool bVar2;
  istream local_3b8 [8];
  istream is;
  undefined1 local_2a0 [8];
  ResourceBuffer rb;
  string local_238 [8];
  ifstream ifs;
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8991fb9c ReadData;
  ResourcePack *pack_local;
  string *sImageFile_local;
  Sprite *this_local;
  
  ReadData.this = (Sprite *)pack;
  if ((this->pColData != (Pixel *)0x0) && (this->pColData != (Pixel *)0x0)) {
    operator_delete__(this->pColData);
  }
  local_30.this = this;
  if (ReadData.this == (Sprite *)0x0) {
    std::ifstream::ifstream(local_238);
    std::ifstream::open(local_238,(_Ios_Openmode)sImageFile);
    bVar1 = std::ifstream::is_open();
    bVar2 = (bVar1 & 1) != 0;
    if (bVar2) {
      LoadFromPGESprFile::anon_class_8_1_8991fb9c::operator()(&local_30,(istream *)local_238);
    }
    this_local._4_4_ = (rcode)bVar2;
    rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
    std::ifstream::~ifstream(local_238);
  }
  else {
    ResourcePack::GetFileBuffer
              ((ResourceBuffer *)local_2a0,(ResourcePack *)ReadData.this,sImageFile);
    std::istream::istream(local_3b8,(streambuf *)local_2a0);
    LoadFromPGESprFile::anon_class_8_1_8991fb9c::operator()(&local_30,local_3b8);
    this_local._4_4_ = OK;
    rb.vMemory.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
    std::istream::~istream(local_3b8);
    ResourceBuffer::~ResourceBuffer((ResourceBuffer *)local_2a0);
  }
  return this_local._4_4_;
}

Assistant:

olc::rcode Sprite::LoadFromPGESprFile(const std::string& sImageFile, olc::ResourcePack* pack)
	{
		if (pColData) delete[] pColData;
		auto ReadData = [&](std::istream& is)
		{
			is.read((char*)&width, sizeof(int32_t));
			is.read((char*)&height, sizeof(int32_t));
			pColData = new Pixel[width * height];
			is.read((char*)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
		};

		// These are essentially Memory Surfaces represented by olc::Sprite
		// which load very fast, but are completely uncompressed
		if (pack == nullptr)
		{
			std::ifstream ifs;
			ifs.open(sImageFile, std::ifstream::binary);
			if (ifs.is_open())
			{
				ReadData(ifs);
				return olc::OK;
			}
			else
				return olc::FAIL;
		}
		else
		{
			ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
			std::istream is(&rb);
			ReadData(is);
			return olc::OK;
		}
		return olc::FAIL;
	}